

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3TermCmp(char *zLhs,int nLhs,char *zRhs,int nRhs)

{
  int iVar1;
  int iVar2;
  
  iVar2 = nLhs - nRhs;
  if (nLhs < nRhs) {
    nRhs = nLhs;
  }
  iVar1 = 0;
  if (((zRhs != (char *)0x0) && (iVar1 = 0, zLhs != (char *)0x0)) && (nRhs != 0)) {
    iVar1 = memcmp(zLhs,zRhs,(long)nRhs);
  }
  if (iVar1 != 0) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int fts3TermCmp(
  const char *zLhs, int nLhs,     /* LHS of comparison */
  const char *zRhs, int nRhs      /* RHS of comparison */
){
  int nCmp = MIN(nLhs, nRhs);
  int res;

  if( nCmp && ALWAYS(zLhs) && ALWAYS(zRhs) ){
    res = memcmp(zLhs, zRhs, nCmp);
  }else{
    res = 0;
  }
  if( res==0 ) res = nLhs - nRhs;

  return res;
}